

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_redundancy_elimination.h
# Opt level: O1

Analysis __thiscall
spvtools::opt::LocalRedundancyEliminationPass::GetPreservedAnalyses
          (LocalRedundancyEliminationPass *this)

{
  return kAnalysisTypes|kAnalysisConstants|kAnalysisNameMap|kAnalysisDominatorAnalysis|kAnalysisCFG|
         kAnalysisCombinators|kAnalysisDecorations|kAnalysisInstrToBlockMapping|kAnalysisBegin;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisDecorations | IRContext::kAnalysisCombinators |
           IRContext::kAnalysisCFG | IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisNameMap | IRContext::kAnalysisConstants |
           IRContext::kAnalysisTypes;
  }